

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::attWildCardIntersection
          (TraverseSchema *this,SchemaAttDef *resultWildCard,SchemaAttDef *compareWildCard)

{
  bool bVar1;
  AttTypes AVar2;
  AttTypes AVar3;
  uint uVar4;
  uint uVar5;
  QName *pQVar6;
  uint *puVar7;
  ValueVectorOf<unsigned_int> *this_00;
  ValueVectorOf<unsigned_int> *this_01;
  QName *pQVar8;
  MemoryManager *local_108;
  XMLSize_t local_f8;
  QName *qnameR;
  MemoryManager *pMStack_d8;
  uint uriName;
  XMLSize_t i_1;
  ValueVectorOf<unsigned_int> tmpURIList_1;
  XMLSize_t listSize_1;
  ValueVectorOf<unsigned_int> *uriListC;
  ValueVectorOf<unsigned_int> *uriListR;
  uint local_7c;
  ulong uStack_78;
  uint nameURI;
  XMLSize_t i;
  ValueVectorOf<unsigned_int> tmpURIList;
  bool found;
  XMLSize_t listSize;
  ValueVectorOf<unsigned_int> *nameURIList;
  uint compareURI;
  AttTypes typeC;
  AttTypes typeR;
  SchemaAttDef *compareWildCard_local;
  SchemaAttDef *resultWildCard_local;
  TraverseSchema *this_local;
  
  AVar2 = XMLAttDef::getType(&resultWildCard->super_XMLAttDef);
  AVar3 = XMLAttDef::getType(&compareWildCard->super_XMLAttDef);
  if ((AVar3 != Any_Any) && (AVar2 != AttTypes_Unknown)) {
    if ((AVar2 == Any_Any) || (AVar3 == AttTypes_Unknown)) {
      SchemaAttDef::resetNamespaceList(resultWildCard);
      copyWildCardData(this,compareWildCard,resultWildCard);
    }
    else if (((AVar3 == Any_Other) && (AVar2 == Any_List)) ||
            ((AVar2 == Any_Other && (AVar3 == Any_List)))) {
      if (AVar3 == Any_List) {
        listSize = (XMLSize_t)SchemaAttDef::getNamespaceList(compareWildCard);
        pQVar6 = SchemaAttDef::getAttName(resultWildCard);
        nameURIList._4_4_ = QName::getURI(pQVar6);
      }
      else {
        listSize = (XMLSize_t)SchemaAttDef::getNamespaceList(resultWildCard);
        pQVar6 = SchemaAttDef::getAttName(compareWildCard);
        nameURIList._4_4_ = QName::getURI(pQVar6);
      }
      if (listSize == 0) {
        local_f8 = 0;
      }
      else {
        local_f8 = ValueVectorOf<unsigned_int>::size((ValueVectorOf<unsigned_int> *)listSize);
      }
      if (local_f8 != 0) {
        tmpURIList.fMemoryManager._7_1_ = 0;
        ValueVectorOf<unsigned_int>::ValueVectorOf
                  ((ValueVectorOf<unsigned_int> *)&i,local_f8,this->fGrammarPoolMemoryManager,false)
        ;
        for (uStack_78 = 0; uStack_78 < local_f8; uStack_78 = uStack_78 + 1) {
          puVar7 = ValueVectorOf<unsigned_int>::elementAt
                             ((ValueVectorOf<unsigned_int> *)listSize,uStack_78);
          local_7c = *puVar7;
          if ((local_7c == nameURIList._4_4_) || (local_7c == this->fEmptyNamespaceURI)) {
            tmpURIList.fMemoryManager._7_1_ = 1;
          }
          else {
            ValueVectorOf<unsigned_int>::addElement((ValueVectorOf<unsigned_int> *)&i,&local_7c);
          }
        }
        if (((tmpURIList.fMemoryManager._7_1_ & 1) != 0) || (AVar3 == Any_List)) {
          SchemaAttDef::setNamespaceList(resultWildCard,(ValueVectorOf<unsigned_int> *)&i);
        }
        ValueVectorOf<unsigned_int>::~ValueVectorOf((ValueVectorOf<unsigned_int> *)&i);
      }
      if (AVar3 == Any_List) {
        copyWildCardData(this,compareWildCard,resultWildCard);
      }
    }
    else if ((AVar2 == Any_List) && (AVar3 == Any_List)) {
      this_00 = SchemaAttDef::getNamespaceList(resultWildCard);
      this_01 = SchemaAttDef::getNamespaceList(compareWildCard);
      if (this_01 == (ValueVectorOf<unsigned_int> *)0x0) {
        local_108 = (MemoryManager *)0x0;
      }
      else {
        local_108 = (MemoryManager *)ValueVectorOf<unsigned_int>::size(this_01);
      }
      tmpURIList_1.fMemoryManager = local_108;
      if (local_108 == (MemoryManager *)0x0) {
        SchemaAttDef::resetNamespaceList(resultWildCard);
      }
      else {
        ValueVectorOf<unsigned_int>::ValueVectorOf
                  ((ValueVectorOf<unsigned_int> *)&i_1,(XMLSize_t)local_108,
                   this->fGrammarPoolMemoryManager,false);
        for (pMStack_d8 = (MemoryManager *)0x0; pMStack_d8 < tmpURIList_1.fMemoryManager;
            pMStack_d8 = (MemoryManager *)((long)&pMStack_d8->_vptr_MemoryManager + 1)) {
          puVar7 = ValueVectorOf<unsigned_int>::elementAt(this_01,(XMLSize_t)pMStack_d8);
          qnameR._4_4_ = *puVar7;
          if ((this_00 != (ValueVectorOf<unsigned_int> *)0x0) &&
             (bVar1 = ValueVectorOf<unsigned_int>::containsElement
                                (this_00,(uint *)((long)&qnameR + 4),0), bVar1)) {
            ValueVectorOf<unsigned_int>::addElement
                      ((ValueVectorOf<unsigned_int> *)&i_1,(uint *)((long)&qnameR + 4));
          }
        }
        SchemaAttDef::setNamespaceList(resultWildCard,(ValueVectorOf<unsigned_int> *)&i_1);
        ValueVectorOf<unsigned_int>::~ValueVectorOf((ValueVectorOf<unsigned_int> *)&i_1);
      }
    }
    else if ((AVar2 == Any_Other) && (AVar3 == Any_Other)) {
      pQVar6 = SchemaAttDef::getAttName(resultWildCard);
      uVar4 = QName::getURI(pQVar6);
      pQVar8 = SchemaAttDef::getAttName(compareWildCard);
      uVar5 = QName::getURI(pQVar8);
      if (uVar4 != uVar5) {
        uVar4 = QName::getURI(pQVar6);
        if (uVar4 == this->fEmptyNamespaceURI) {
          pQVar8 = SchemaAttDef::getAttName(compareWildCard);
          uVar4 = QName::getURI(pQVar8);
          QName::setURI(pQVar6,uVar4);
        }
        else {
          pQVar8 = SchemaAttDef::getAttName(compareWildCard);
          uVar4 = QName::getURI(pQVar8);
          if (uVar4 != this->fEmptyNamespaceURI) {
            QName::setURI(pQVar6,this->fEmptyNamespaceURI);
            XMLAttDef::setType(&resultWildCard->super_XMLAttDef,AttTypes_Unknown);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
TraverseSchema::attWildCardIntersection(SchemaAttDef* const resultWildCard,
                                        const SchemaAttDef* const compareWildCard) {

    XMLAttDef::AttTypes typeR = resultWildCard->getType();
    XMLAttDef::AttTypes typeC = compareWildCard->getType();

    //If either O1 or O2 is any, then the other must be the value.
    if (typeC == XMLAttDef::Any_Any ||
        typeR == XMLAttDef::AttTypes_Unknown) {
        return;
    }

    if (typeR == XMLAttDef::Any_Any ||
        typeC == XMLAttDef::AttTypes_Unknown) {

        resultWildCard->resetNamespaceList();
        copyWildCardData(compareWildCard, resultWildCard);
        return;
    }

    // If either O1 or O2 is a pair of not and a namespace name and the other
    // is a set, then that set, minus the negated namespace name if it was in
    // is the value
    if ((typeC == XMLAttDef::Any_Other && typeR == XMLAttDef::Any_List) ||
        (typeR == XMLAttDef::Any_Other && typeC == XMLAttDef::Any_List)) {

        unsigned int compareURI = 0;
        ValueVectorOf<unsigned int>* nameURIList = 0;

        if (typeC == XMLAttDef::Any_List) {
            nameURIList = compareWildCard->getNamespaceList();
            compareURI = resultWildCard->getAttName()->getURI();
        }
        else {
            nameURIList = resultWildCard->getNamespaceList();
            compareURI = compareWildCard->getAttName()->getURI();
        }

        XMLSize_t listSize = (nameURIList) ? nameURIList->size() : 0;

        if (listSize) {

            bool                        found = false;
            ValueVectorOf<unsigned int> tmpURIList(listSize, fGrammarPoolMemoryManager);

            for (XMLSize_t i=0; i < listSize; i++) {

                unsigned int nameURI = nameURIList->elementAt(i);

                if (nameURI != compareURI &&
                    nameURI != (unsigned int) fEmptyNamespaceURI) {
                    tmpURIList.addElement(nameURI);
                }
                else {
                    found = true;
                }
            }

            if (found || typeC == XMLAttDef::Any_List) {
                resultWildCard->setNamespaceList(&tmpURIList);
            }
        }

        if (typeC == XMLAttDef::Any_List) {
            copyWildCardData(compareWildCard, resultWildCard);
        }

        return;
    }

    // If both O1 and O2 are sets, then the intersection of those sets must be
    // the value.
    if (typeR == XMLAttDef::Any_List && typeC == XMLAttDef::Any_List) {

        ValueVectorOf<unsigned int>* uriListR = resultWildCard->getNamespaceList();
        ValueVectorOf<unsigned int>* uriListC = compareWildCard->getNamespaceList();
        XMLSize_t listSize = (uriListC) ? uriListC->size() : 0;

        if (listSize) {

            ValueVectorOf<unsigned int> tmpURIList(listSize, fGrammarPoolMemoryManager);

            for (XMLSize_t i=0; i < listSize; i++) {

                unsigned int uriName = uriListC->elementAt(i);

                if (uriListR && uriListR->containsElement(uriName)) {
                    tmpURIList.addElement(uriName);
                }
            }

            resultWildCard->setNamespaceList(&tmpURIList);
        }
        else {
            resultWildCard->resetNamespaceList();
        }

        return;
    }

    // If the two are negations of different namespace names, then:
    //  if one is a negation of absent, then result is negation of namespace
    //  else intersection is not expressible.
    if (typeR == XMLAttDef::Any_Other && typeC == XMLAttDef::Any_Other) {

        QName* qnameR = resultWildCard->getAttName();

        if (qnameR->getURI() != compareWildCard->getAttName()->getURI()) {

            if (qnameR->getURI() == (unsigned int)fEmptyNamespaceURI) {
                qnameR->setURI(compareWildCard->getAttName()->getURI());
            }
            else if (compareWildCard->getAttName()->getURI() != (unsigned int)fEmptyNamespaceURI) {

                qnameR->setURI(fEmptyNamespaceURI);
                resultWildCard->setType(XMLAttDef::AttTypes_Unknown);
            }
        }
    }
}